

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.cxx
# Opt level: O0

bool cmFunctionCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *args,cmExecutionStatus *status)

{
  cmExecutionStatus *this;
  bool bVar1;
  pointer pcVar2;
  cmMakefile *this_00;
  unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_68;
  unique_ptr<(anonymous_namespace)::cmFunctionFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmFunctionFunctionBlocker>_>
  local_60;
  __single_object fb;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  this = local_20;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    std::make_unique<(anonymous_namespace)::cmFunctionFunctionBlocker>();
    pcVar2 = std::
             unique_ptr<(anonymous_namespace)::cmFunctionFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmFunctionFunctionBlocker>_>
             ::operator->(&local_60);
    cm::
    append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              (&pcVar2->Args,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)status_local);
    this_00 = cmExecutionStatus::GetMakefile(local_20);
    std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>::
    unique_ptr<(anonymous_namespace)::cmFunctionFunctionBlocker,std::default_delete<(anonymous_namespace)::cmFunctionFunctionBlocker>,void>
              ((unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>> *)&local_68,
               &local_60);
    cmMakefile::AddFunctionBlocker(this_00,&local_68);
    std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>::~unique_ptr
              (&local_68);
    args_local._7_1_ = 1;
    std::
    unique_ptr<(anonymous_namespace)::cmFunctionFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmFunctionFunctionBlocker>_>
    ::~unique_ptr(&local_60);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmFunctionCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // create a function blocker
  auto fb = cm::make_unique<cmFunctionFunctionBlocker>();
  cm::append(fb->Args, args);
  status.GetMakefile().AddFunctionBlocker(std::move(fb));

  return true;
}